

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall Js::InterpreterStackFrame::ProcessCatch(InterpreterStackFrame *this)

{
  bool bVar1;
  ThreadContext *pTVar2;
  InterpreterStackFrame *this_local;
  
  bVar1 = ScriptContext::ShouldPerformRecordOrReplayDebuggerAction(*(ScriptContext **)(this + 0x78))
  ;
  if (bVar1) {
    pTVar2 = ScriptContext::GetThreadContext(*(ScriptContext **)(this + 0x78));
    TTD::ExecutionInfoManager::ProcessCatchInfoForLastExecutedStatements(pTVar2->TTDExecutionInfo);
  }
  bVar1 = IsInDebugMode(this);
  if (bVar1) {
    DebugProcess(this);
  }
  else {
    Process(this);
  }
  return;
}

Assistant:

void InterpreterStackFrame::ProcessCatch()
    {
#if ENABLE_TTD
        //Clear any previous Exception Info
        if (SHOULD_DO_TTD_STACK_STMT_OP(this->scriptContext))
        {
            this->scriptContext->GetThreadContext()->TTDExecutionInfo->ProcessCatchInfoForLastExecutedStatements();
        }
#endif
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->IsInDebugMode())
        {
            this->DebugProcess();
        }
        else
#endif
        {
            this->Process();
        }
    }